

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTests.cpp
# Opt level: O3

void globAndCheck(path *basePath,string_view pattern,GlobMode mode,GlobRank expectedRank,
                 error_code expectedEc,initializer_list<const_char_*> expected)

{
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var1;
  char cVar2;
  uint uVar3;
  int iVar4;
  char **ppcVar5;
  long lVar6;
  iterator ppcVar7;
  path *ppVar8;
  long *extraout_RDX;
  _List *p_Var9;
  pointer ppVar10;
  AssertionHandler *pAVar11;
  AssertionHandler *pAVar12;
  undefined8 *in_R9;
  long lVar13;
  string_view pattern_00;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  char *str;
  AssertionHandler catchAssertionHandler;
  GlobRank rank;
  error_code ec;
  SmallVector<std::filesystem::__cxx11::path,_2UL> results;
  undefined4 in_stack_fffffffffffffe50;
  undefined1 local_1a8 [8];
  undefined8 local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  char *local_188;
  iterator local_180;
  ReusableStringStream local_178;
  SourceLineInfo local_168;
  IResultCapture local_158 [2];
  AssertionHandler local_148;
  GlobRank local_100;
  GlobRank local_fc;
  undefined1 local_f8 [56];
  path *local_c0;
  IResultCapture *local_b8;
  path *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  SmallVectorBase<std::filesystem::__cxx11::path> local_98;
  
  pattern_00._M_len = (IResultCapture *)pattern._M_str;
  local_98.data_ = (pointer)local_98.firstElement;
  local_98.len = 0;
  local_98.cap = 2;
  local_f8._40_4_ = 0;
  local_fc = expectedRank;
  local_f8._48_8_ = std::_V2::system_category();
  pattern_00._M_str._0_4_ = mode;
  pattern_00._M_str._4_4_ = 0;
  local_c0 = (path *)pattern._M_len;
  local_b8 = pattern_00._M_len;
  local_100 = slang::svGlob((slang *)basePath,(path *)pattern._M_len,pattern_00,(GlobMode)&local_98,
                            (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x1,
                            (bool)((char)local_f8 + '('),
                            (error_code *)CONCAT44(mode,in_stack_fffffffffffffe50));
  local_1a8 = (undefined1  [8])0xa0c24b;
  local_1a0 = 0x67;
  capturedExpression.m_size = 0x14;
  capturedExpression.m_start = "rank == expectedRank";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_148,macroName,(SourceLineInfo *)local_1a8,capturedExpression,ContinueOnFailure);
  local_198._M_allocated_capacity = (size_type)&local_100;
  local_180 = (iterator)&local_fc;
  local_1a0._0_2_ = CONCAT11(local_100 == local_fc,true);
  local_1a8 = (undefined1  [8])&PTR_streamReconstructedExpression_00c920f0;
  local_198._8_8_ = (long)"!==" + 1;
  local_188 = (char *)0x2;
  Catch::AssertionHandler::handleExpr(&local_148,(ITransientExpression *)local_1a8);
  Catch::AssertionHandler::complete(&local_148);
  if (local_148.m_completed == false) {
    (*(local_148.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  local_1a8 = (undefined1  [8])0xa0c24b;
  local_1a0 = 0x68;
  capturedExpression_00.m_size = 0x21;
  capturedExpression_00.m_start = "results.size() == expected.size()";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&local_148,macroName_00,(SourceLineInfo *)local_1a8,capturedExpression_00,
             ContinueOnFailure);
  local_1a0._0_2_ = CONCAT11((iterator)local_98.len == expected._M_array,true);
  local_1a8 = (undefined1  [8])&PTR_streamReconstructedExpression_00c8bc48;
  local_198._M_allocated_capacity = local_98.len;
  local_198._8_8_ = (long)"!==" + 1;
  local_188 = (char *)0x2;
  local_180 = expected._M_array;
  pAVar12 = (AssertionHandler *)local_1a8;
  Catch::AssertionHandler::handleExpr(&local_148,(ITransientExpression *)local_1a8);
  Catch::AssertionHandler::complete(&local_148);
  if (local_148.m_completed == false) {
    pAVar12 = &local_148;
    (*(local_148.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  pAVar11 = (AssertionHandler *)&expectedEc;
  if (((error_category *)local_f8._48_8_ != expectedEc._M_cat) ||
     (local_f8._40_4_ != expectedEc._M_value)) {
    local_148.m_assertionInfo.macroName.m_start._0_4_ = std::error_code::default_error_condition();
    pAVar12 = (AssertionHandler *)(ulong)(uint)expectedEc._M_value;
    local_148.m_assertionInfo.macroName.m_size = (size_type)extraout_RDX;
    cVar2 = (**(code **)(*(long *)expectedEc._M_cat + 0x30))(expectedEc._M_cat,pAVar12,&local_148);
    if ((cVar2 == '\0') &&
       (cVar2 = (**(code **)(*(long *)local_148.m_assertionInfo.macroName.m_size + 0x38))
                          (local_148.m_assertionInfo.macroName.m_size,pAVar11,
                           local_148.m_assertionInfo.macroName.m_start._0_4_), pAVar12 = pAVar11,
       cVar2 == '\0')) {
      local_1a8 = (undefined1  [8])0xa0c24b;
      local_1a0 = 0x6b;
      macroName_01.m_size = 10;
      macroName_01.m_start = "FAIL_CHECK";
      Catch::AssertionHandler::AssertionHandler
                (&local_148,macroName_01,(SourceLineInfo *)local_1a8,(StringRef)ZEXT816(0x9db414),
                 ContinueOnFailure);
      local_178.m_index = 0;
      local_178.m_oss = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream(&local_178);
      (**(code **)(*(long *)local_f8._48_8_ + 0x20))(local_f8,local_f8._48_8_,local_f8._40_4_);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_178.m_oss,(char *)local_f8._0_8_,local_f8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(local_178.m_oss," != ",4);
      (**(code **)(*(long *)expectedEc._M_cat + 0x20))
                (&local_168,expectedEc._M_cat,expectedEc._M_value);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_178.m_oss,local_168.file,local_168.line);
      Catch::ReusableStringStream::str_abi_cxx11_((string *)local_1a8,&local_178);
      pAVar12 = (AssertionHandler *)0x12;
      Catch::AssertionHandler::handleMessage(&local_148,ExplicitFailure,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])&local_198) {
        pAVar12 = (AssertionHandler *)(local_198._M_allocated_capacity + 1);
        operator_delete((void *)local_1a8,(size_t)pAVar12);
      }
      if ((IResultCapture *)local_168.file != local_158) {
        pAVar12 = (AssertionHandler *)((long)local_158[0]._vptr_IResultCapture + 1);
        operator_delete(local_168.file,(size_t)pAVar12);
      }
      if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
        pAVar12 = (AssertionHandler *)(local_f8._16_8_ + 1);
        operator_delete((void *)local_f8._0_8_,(size_t)pAVar12);
      }
      Catch::ReusableStringStream::~ReusableStringStream(&local_178);
      Catch::AssertionHandler::complete(&local_148);
      if (local_148.m_completed == false) {
        pAVar12 = &local_148;
        (*(local_148.m_resultCapture)->_vptr_IResultCapture[0x14])();
      }
    }
  }
  if (expected._M_array != (iterator)0x0) {
    local_a8 = in_R9 + (long)expected._M_array;
    do {
      local_178.m_index = *in_R9;
      local_168.line = CONCAT44(local_168.line._4_4_,mode);
      local_168.file = (char *)local_178.m_index;
      if ((iterator)local_98.len == (iterator)0x0) {
        ppcVar7 = (iterator)0x0;
        ppVar8 = local_98.data_;
      }
      else {
        local_b0 = local_98.data_ + local_98.len;
        p_Var9 = &(local_98.data_)->_M_cmpts;
        lVar13 = local_98.len * 0x28;
        local_a0 = in_R9;
        do {
          ppVar8 = (path *)(p_Var9 + -4);
          cVar2 = std::filesystem::__cxx11::path::has_filename();
          if (cVar2 == '\0') {
            std::filesystem::__cxx11::path::parent_path();
            if (local_1a0 == 0) {
LAB_0058b842:
              std::filesystem::__cxx11::path::path((path *)&local_148);
            }
            else {
              pAVar12 = (AssertionHandler *)local_1a8;
              if ((~(byte)local_188 & 3) != 0) {
                if ((((ulong)local_188 & 3) == 0) &&
                   (*(char *)((long)local_1a8 + (local_1a0 - 1)) != '/')) {
                  uVar3 = (uint)((ulong)local_188 & 3);
                  if (((ulong)local_188 & 3) == 0) {
                    lVar6 = std::filesystem::__cxx11::path::_List::end();
                    ppcVar5 = (char **)(lVar6 + -0x10);
                    pAVar12 = (AssertionHandler *)(lVar6 + -0x30);
                    if (((ulong)local_188 & 3) != 0) {
                      ppcVar5 = &local_188;
                      pAVar12 = (AssertionHandler *)local_1a8;
                    }
                    uVar3 = (uint)*ppcVar5 & 3;
                  }
                  if (uVar3 == 3) goto LAB_0058b838;
                }
                goto LAB_0058b842;
              }
LAB_0058b838:
              std::filesystem::__cxx11::path::path((path *)&local_148,(path *)pAVar12);
            }
            std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                      ((path *)local_f8,&local_168.file,auto_format);
            pAVar12 = (AssertionHandler *)local_f8;
            iVar4 = std::filesystem::__cxx11::path::compare((path *)&local_148);
            std::filesystem::__cxx11::path::~path((path *)local_f8);
            std::filesystem::__cxx11::path::~path((path *)&local_148);
            pAVar11 = (AssertionHandler *)local_1a8;
          }
          else {
            if (*(size_type *)(p_Var9 + -3) == 0) {
LAB_0058b8b1:
              std::filesystem::__cxx11::path::path((path *)&local_148);
            }
            else {
              _Var1._M_head_impl =
                   (p_Var9->_M_impl)._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl;
              uVar3 = (uint)_Var1._M_head_impl;
              if (((ulong)_Var1._M_head_impl & 3) == 0) {
                if ((ppVar8->_M_pathname)._M_dataplus._M_p[*(size_type *)(p_Var9 + -3) - 1] != '/')
                {
                  if (((ulong)_Var1._M_head_impl & 3) == 0) {
                    lVar6 = std::filesystem::__cxx11::path::_List::end();
                    if (((ulong)(p_Var9->_M_impl)._M_t.
                                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                .
                                super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                ._M_head_impl & 3) == 0) {
                      ppVar8 = (path *)(lVar6 + -0x30);
                    }
                    uVar3 = (uint)(ppVar8->_M_cmpts)._M_impl._M_t.
                                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  .
                                  super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                  ._M_head_impl;
                  }
                  if ((~uVar3 & 3) == 0) goto LAB_0058b7b6;
                }
                goto LAB_0058b8b1;
              }
              if ((uVar3 & 3) != 3) goto LAB_0058b8b1;
LAB_0058b7b6:
              std::filesystem::__cxx11::path::path((path *)&local_148,ppVar8);
            }
            std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                      ((path *)local_1a8,&local_168.file,auto_format);
            pAVar12 = (AssertionHandler *)local_1a8;
            iVar4 = std::filesystem::__cxx11::path::compare((path *)&local_148);
            std::filesystem::__cxx11::path::~path((path *)local_1a8);
            pAVar11 = &local_148;
          }
          std::filesystem::__cxx11::path::~path((path *)pAVar11);
          ppcVar7 = (iterator)local_98.len;
          in_R9 = local_a0;
          if (iVar4 == 0) {
            ppVar8 = (path *)(p_Var9 + -4);
            break;
          }
          p_Var9 = p_Var9 + 5;
          lVar13 = lVar13 + -0x28;
          ppVar8 = local_b0;
        } while (lVar13 != 0);
      }
      if (ppVar8 == local_98.data_ + (long)ppcVar7) {
        local_1a8 = (undefined1  [8])0xa0c24b;
        local_1a0 = 0x73;
        macroName_02.m_size = 10;
        macroName_02.m_start = "FAIL_CHECK";
        Catch::AssertionHandler::AssertionHandler
                  (&local_148,macroName_02,(SourceLineInfo *)local_1a8,(StringRef)ZEXT816(0x9db414),
                   ContinueOnFailure);
        local_f8._0_8_ = (undefined **)0x0;
        local_f8._8_8_ = (ostream *)0x0;
        Catch::ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_f8);
        Catch::ReusableStringStream::operator<<
                  ((ReusableStringStream *)local_f8,(char **)&local_178);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_f8._8_8_," is not found in results for ",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_f8._8_8_,(char *)local_b8,(long)local_c0);
        Catch::ReusableStringStream::str_abi_cxx11_
                  ((string *)local_1a8,(ReusableStringStream *)local_f8);
        pAVar12 = (AssertionHandler *)0x12;
        Catch::AssertionHandler::handleMessage(&local_148,ExplicitFailure,(string *)local_1a8);
        if (local_1a8 != (undefined1  [8])&local_198) {
          pAVar12 = (AssertionHandler *)(local_198._M_allocated_capacity + 1);
          operator_delete((void *)local_1a8,(size_t)pAVar12);
        }
        Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_f8);
        Catch::AssertionHandler::complete(&local_148);
        if (local_148.m_completed == false) {
          pAVar12 = &local_148;
          (*(local_148.m_resultCapture)->_vptr_IResultCapture[0x14])();
        }
      }
      in_R9 = in_R9 + 1;
    } while (in_R9 != local_a8);
  }
  if ((iterator)local_98.len != (iterator)0x0) {
    lVar13 = local_98.len * 0x28;
    ppVar10 = local_98.data_;
    do {
      if (mode == Files) {
        local_168.file =
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
        ;
        local_168.line = 0x79;
        capturedExpression_02.m_size = 0x19;
        capturedExpression_02.m_start = "fs::is_regular_file(path)";
        macroName_04.m_size = 5;
        macroName_04.m_start = "CHECK";
        Catch::AssertionHandler::AssertionHandler
                  (&local_148,macroName_04,&local_168,capturedExpression_02,ContinueOnFailure);
        cVar2 = std::filesystem::status(ppVar10);
        local_f8._0_8_ = &PTR_streamReconstructedExpression_00c896a0;
        local_f8._8_8_ =
             (ulong)CONCAT52(local_f8._11_5_,CONCAT11(cVar2 == '\x01',cVar2 == '\x01')) << 8;
        pAVar12 = (AssertionHandler *)local_f8;
        Catch::AssertionHandler::handleExpr(&local_148,(ITransientExpression *)pAVar12);
        Catch::AssertionHandler::complete(&local_148);
        if (local_148.m_completed == false) {
          pAVar12 = &local_148;
          (*(local_148.m_resultCapture)->_vptr_IResultCapture[0x14])();
        }
      }
      else {
        local_168.file =
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
        ;
        local_168.line = 0x7b;
        capturedExpression_01.m_size = 0x16;
        capturedExpression_01.m_start = "fs::is_directory(path)";
        macroName_03.m_size = 5;
        macroName_03.m_start = "CHECK";
        Catch::AssertionHandler::AssertionHandler
                  (&local_148,macroName_03,&local_168,capturedExpression_01,ContinueOnFailure);
        cVar2 = std::filesystem::status(ppVar10);
        local_1a8 = (undefined1  [8])&PTR_streamReconstructedExpression_00c896a0;
        local_1a0 = (ulong)CONCAT52(local_1a0._3_5_,CONCAT11(cVar2 == '\x02',cVar2 == '\x02')) << 8;
        pAVar12 = (AssertionHandler *)local_1a8;
        Catch::AssertionHandler::handleExpr(&local_148,(ITransientExpression *)pAVar12);
        Catch::AssertionHandler::complete(&local_148);
        if (local_148.m_completed == false) {
          pAVar12 = &local_148;
          (*(local_148.m_resultCapture)->_vptr_IResultCapture[0x14])();
        }
      }
      ppVar10 = ppVar10 + 1;
      lVar13 = lVar13 + -0x28;
    } while (lVar13 != 0);
  }
  slang::SmallVectorBase<std::filesystem::__cxx11::path>::cleanup(&local_98,(EVP_PKEY_CTX *)pAVar12)
  ;
  return;
}

Assistant:

static void globAndCheck(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                         GlobRank expectedRank, std::error_code expectedEc,
                         std::initializer_list<const char*> expected) {
    SmallVector<fs::path> results;
    std::error_code ec;
    auto rank = svGlob(basePath, pattern, mode, results, /* expandEnvVars */ true, ec);

    CHECK(rank == expectedRank);
    CHECK(results.size() == expected.size());

    if (ec != expectedEc && ec.default_error_condition() != expectedEc)
        FAIL_CHECK(ec.message() << " != " << expectedEc.message());

    for (auto str : expected) {
        auto it = std::ranges::find_if(results, [str, mode](auto& item) {
            return item.has_filename() ? item.filename() == str
                                       : item.parent_path().filename() == str;
        });
        if (it == results.end()) {
            FAIL_CHECK(str << " is not found in results for " << pattern);
        }
    }

    for (auto& path : results) {
        if (mode == GlobMode::Files)
            CHECK(fs::is_regular_file(path));
        else
            CHECK(fs::is_directory(path));
    }
}